

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fvk_algorithm.c
# Opt level: O2

void fvk_a(void)

{
  long lVar1;
  long lVar2;
  long lVar3;
  int i;
  long lVar4;
  solver_state_a s;
  
  setup_simple_state_a(&two_dof_robot_a,&s);
  lVar1 = 0;
  lVar2 = 0;
  for (lVar4 = 1; lVar4 <= s.nbody; lVar4 = lVar4 + 1) {
    lVar3 = _two_dof_robot_c + lVar1 + 0x20;
    kca_fpk(lVar3,(long)&(s.x_jnt)->target_body + lVar2);
    ga_pose_compose((long)&(s.x_jnt)->target_body + lVar2,_two_dof_robot_c + lVar1,
                    (long)&(s.x_rel)->target_body + lVar2);
    kca_fvk(lVar3,(long)&(s.xd_jnt)->target_body + lVar2);
    ga_twist_tf_ref_to_tgt
              ((long)&(s.x_rel)->target_body + lVar2,(long)&(s.xd)->target_body + lVar2,
               (long)&(s.xd_tf)->target_body + lVar2);
    ga_twist_accumulate((long)&(s.xd_tf)->target_body + lVar2,(long)&(s.xd_jnt)->target_body + lVar2
                        ,(long)&s.xd[1].target_body + lVar2);
    lVar1 = lVar1 + 0x60;
    lVar2 = lVar2 + 0x20;
  }
  ga_twist_log(s.xd + s.nbody);
  return;
}

Assistant:

void fvk_a()
{
    struct kca_kinematic_chain *kc = &two_dof_robot_a;
    struct solver_state_a s;

    setup_simple_state_a(kc, &s);


    for (int i = 1; i < s.nbody + 1; i++) {
        struct kca_joint *joint = &kc->segment[i - 1].joint;

        // Position
        //

        // X_{J,i}
        kca_fpk(joint, &s.x_jnt[i - 1]);

        // i^X_{i-1} = X_{J,i} X_{T,i}
        ga_pose_compose(&s.x_jnt[i - 1], &kc->segment[i - 1].joint_attachment, &s.x_rel[i - 1]);


        // Velocity
        //

        // Xd_{J,i} = S qd
        kca_fvk(joint, &s.xd_jnt[i - 1]);

        // Xd_{i-1}' = i^X_{i-1} Xd_{i-1}
        ga_twist_tf_ref_to_tgt(&s.x_rel[i - 1], &s.xd[i - 1], &s.xd_tf[i - 1]);

        // Xd_i = Xd_{i-1}' + Xd_{J,i}
        ga_twist_accumulate(&s.xd_tf[i - 1], &s.xd_jnt[i - 1], &s.xd[i]);
    }

    ga_twist_log(&s.xd[s.nbody]);
}